

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

uint __thiscall
crnlib::ktx_texture::add_key_value(ktx_texture *this,char *pKey,void *pVal,uint val_size)

{
  uint uVar1;
  vector<unsigned_char> *p;
  vector<unsigned_char> *in_RSI;
  long in_RDI;
  uint8_vec *v;
  uint idx;
  uint n;
  undefined8 in_stack_ffffffffffffffc8;
  vector<crnlib::vector<unsigned_char>_> *in_stack_ffffffffffffffd0;
  
  uVar1 = vector<crnlib::vector<unsigned_char>_>::size
                    ((vector<crnlib::vector<unsigned_char>_> *)(in_RDI + 0x40));
  vector<crnlib::vector<unsigned_char>_>::resize
            (in_stack_ffffffffffffffd0,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
  p = vector<crnlib::vector<unsigned_char>_>::back
                ((vector<crnlib::vector<unsigned_char>_> *)(in_RDI + 0x40));
  strlen((char *)in_RSI);
  n = (uint)((ulong)in_RDI >> 0x20);
  vector<unsigned_char>::append(in_RSI,(uchar *)p,n);
  vector<unsigned_char>::append(in_RSI,(uchar *)p,n);
  return uVar1;
}

Assistant:

uint ktx_texture::add_key_value(const char* pKey, const void* pVal, uint val_size) {
  const uint idx = m_key_values.size();
  m_key_values.resize(idx + 1);
  uint8_vec& v = m_key_values.back();
  v.append(reinterpret_cast<const uint8*>(pKey), static_cast<uint>(strlen(pKey)) + 1);
  v.append(static_cast<const uint8*>(pVal), val_size);
  return idx;
}